

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O0

void printAddress(MCInst *MI,uint Base,int64_t Disp,uint Index,SStream *O)

{
  long lVar1;
  sysz_reg sVar2;
  char *pcVar3;
  uint in_ECX;
  undefined8 in_RDX;
  uint in_ESI;
  long in_RDI;
  SStream *in_R8;
  char *in_stack_ffffffffffffffc8;
  SStream *in_stack_ffffffffffffffd0;
  SStream *ss;
  
  printInt64(in_stack_ffffffffffffffd0,(int64_t)in_stack_ffffffffffffffc8);
  if (in_ESI == 0) {
    if ((in_ECX == 0) && (*(int *)(*(long *)(in_RDI + 800) + 0x60) != 0)) {
      *(undefined4 *)
       (*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) + 0x60 +
       (ulong)*(byte *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) + 0x5c) * 0x20) = 2;
      *(undefined8 *)
       (*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) +
        (ulong)*(byte *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) + 0x5c) * 0x20 + 0x68) = in_RDX
      ;
      lVar1 = *(long *)(*(long *)(in_RDI + 0x310) + 0xf0);
      *(char *)(lVar1 + 0x5c) = *(char *)(lVar1 + 0x5c) + '\x01';
    }
  }
  else {
    SStream_concat0(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (in_ECX != 0) {
      ss = in_R8;
      pcVar3 = getRegisterName(in_ECX);
      SStream_concat(ss,"%%%s, ",pcVar3);
    }
    pcVar3 = getRegisterName(in_ESI);
    SStream_concat(in_R8,"%%%s)",pcVar3);
    if (*(int *)(*(long *)(in_RDI + 800) + 0x60) != 0) {
      *(undefined4 *)
       (*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) + 0x60 +
       (ulong)*(byte *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) + 0x5c) * 0x20) = 3;
      sVar2 = SystemZ_map_register(in_ESI);
      *(char *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) +
                (ulong)*(byte *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) + 0x5c) * 0x20 + 0x68)
           = (char)sVar2;
      sVar2 = SystemZ_map_register(in_ECX);
      *(char *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) +
                (ulong)*(byte *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) + 0x5c) * 0x20 + 0x69)
           = (char)sVar2;
      *(undefined8 *)
       (*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) +
        (ulong)*(byte *)(*(long *)(*(long *)(in_RDI + 0x310) + 0xf0) + 0x5c) * 0x20 + 0x78) = in_RDX
      ;
      lVar1 = *(long *)(*(long *)(in_RDI + 0x310) + 0xf0);
      *(char *)(lVar1 + 0x5c) = *(char *)(lVar1 + 0x5c) + '\x01';
    }
  }
  return;
}

Assistant:

static void printAddress(MCInst *MI, unsigned Base, int64_t Disp, unsigned Index, SStream *O)
{
	printInt64(O, Disp);

	if (Base) {
		SStream_concat0(O, "(");
		if (Index)
			SStream_concat(O, "%%%s, ", getRegisterName(Index));
		SStream_concat(O, "%%%s)", getRegisterName(Base));

		if (MI->csh->detail) {
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_MEM;
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.base = (uint8_t)SystemZ_map_register(Base);
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.index = (uint8_t)SystemZ_map_register(Index);
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.disp = Disp;
			MI->flat_insn->detail->sysz.op_count++;
		}
	} else if (!Index) {
		if (MI->csh->detail) {
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_IMM;
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].imm = Disp;
			MI->flat_insn->detail->sysz.op_count++;
		}
	}
}